

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O2

void __thiscall
TypedAddress_Increment_Test::TypedAddress_Increment_Test(TypedAddress_Increment_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00252258;
  return;
}

Assistant:

TEST (TypedAddress, Increment) {
    {
        // Pre-increment
        auto a1 = pstore::typed_address<std::uint64_t>::null ();
        auto r1 = ++a1;
        EXPECT_EQ (pstore::typed_address<std::uint64_t>::make (sizeof (std::uint64_t)), a1);
        EXPECT_EQ (pstore::typed_address<std::uint64_t>::make (sizeof (std::uint64_t)), r1);
    }
    {
        // Post-increment.
        auto a2 = pstore::typed_address<std::uint64_t>::null ();
        auto r2 = a2++;
        EXPECT_EQ (pstore::typed_address<std::uint64_t>::make (sizeof (std::uint64_t)), a2);
        EXPECT_EQ (pstore::typed_address<std::uint64_t>::null (), r2);
    }
}